

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::AnimationCurve::AnimationCurve
          (AnimationCurve *this,uint64_t id,Element *element,string *name,Document *param_4)

{
  pointer plVar1;
  pointer plVar2;
  bool bVar3;
  Scope *sc;
  Element *pEVar4;
  Element *el;
  allocator<char> local_61;
  string local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<float,_std::allocator<float>_> *local_38;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationCurve_007f1a70;
  local_38 = &this->attributes;
  local_40 = &this->flags;
  (this->keys).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->keys).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->keys).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->attributes).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attributes).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sc = GetRequiredScope(element);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"KeyTime",&local_61);
  pEVar4 = GetRequiredElement(sc,&local_60,(Element *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"KeyValueFloat",&local_61);
  el = GetRequiredElement(sc,&local_60,(Element *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  ParseVectorDataArray(&this->keys,pEVar4);
  ParseVectorDataArray(&this->values,el);
  plVar1 = (this->keys).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar2 = (this->keys).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)plVar2 - (long)plVar1 >> 3 !=
      (long)(this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,
               "the number of key times does not match the number of keyframe values",&local_61);
    Util::DOMError(&local_60,pEVar4);
  }
  bVar3 = std::
          equal<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::less<long>>
                    (plVar1,plVar2 + -1,plVar1 + 1);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"KeyAttrDataFloat",&local_61);
    pEVar4 = Scope::operator[](sc,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (pEVar4 != (Element *)0x0) {
      ParseVectorDataArray(local_38,pEVar4);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"KeyAttrFlags",&local_61)
    ;
    pEVar4 = Scope::operator[](sc,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (pEVar4 != (Element *)0x0) {
      ParseVectorDataArray(local_40,pEVar4);
    }
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"the keyframes are not in ascending order",&local_61);
  Util::DOMError(&local_60,pEVar4);
}

Assistant:

AnimationCurve::AnimationCurve(uint64_t id, const Element& element, const std::string& name, const Document& /*doc*/)
: Object(id, element, name)
{
    const Scope& sc = GetRequiredScope(element);
    const Element& KeyTime = GetRequiredElement(sc,"KeyTime");
    const Element& KeyValueFloat = GetRequiredElement(sc,"KeyValueFloat");

    ParseVectorDataArray(keys, KeyTime);
    ParseVectorDataArray(values, KeyValueFloat);

    if(keys.size() != values.size()) {
        DOMError("the number of key times does not match the number of keyframe values",&KeyTime);
    }

    // check if the key times are well-ordered
    if(!std::equal(keys.begin(), keys.end() - 1, keys.begin() + 1, std::less<KeyTimeList::value_type>())) {
        DOMError("the keyframes are not in ascending order",&KeyTime);
    }

    const Element* KeyAttrDataFloat = sc["KeyAttrDataFloat"];
    if(KeyAttrDataFloat) {
        ParseVectorDataArray(attributes, *KeyAttrDataFloat);
    }

    const Element* KeyAttrFlags = sc["KeyAttrFlags"];
    if(KeyAttrFlags) {
        ParseVectorDataArray(flags, *KeyAttrFlags);
    }
}